

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::RpcDumper::Sender::~Sender(Sender *this)

{
  Maybe<capnp::_::(anonymous_namespace)::RpcDumper::Sender_&> local_38;
  Sender *local_30;
  Sender *p;
  Sender *local_18;
  Sender *_p58;
  Sender *this_local;
  
  _p58 = this;
  local_18 = kj::_::readMaybe<capnp::_::(anonymous_namespace)::RpcDumper::Sender>(&this->partner);
  if (local_18 != (Sender *)0x0) {
    local_30 = local_18;
    kj::Maybe<capnp::_::(anonymous_namespace)::RpcDumper::Sender_&>::Maybe(&local_38);
    kj::Maybe<capnp::_::(anonymous_namespace)::RpcDumper::Sender_&>::operator=
              (&local_30->partner,&local_38);
  }
  kj::HashMap<unsigned_int,_capnp::Schema>::~HashMap(&this->returnTypes);
  return;
}

Assistant:

~Sender() noexcept(false) {
      KJ_IF_SOME(p, partner) {
        p.partner = kj::none;
      }
    }